

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_hodgkinHuxleyDefinedUsingImports_Test::
~ModelFlattening_hodgkinHuxleyDefinedUsingImports_Test
          (ModelFlattening_hodgkinHuxleyDefinedUsingImports_Test *this)

{
  ModelFlattening_hodgkinHuxleyDefinedUsingImports_Test *this_local;
  
  ~ModelFlattening_hodgkinHuxleyDefinedUsingImports_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ModelFlattening, hodgkinHuxleyDefinedUsingImports)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("modelflattening/hodgkin_huxley_squid_axon_model_1952/model.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("modelflattening/hodgkin_huxley_squid_axon_model_1952/"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    model = importer->flattenModel(model);

    auto printer = libcellml::Printer::create();

    auto a = printer->printModel(model);
    auto modelNonImportVersion = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));
    auto e = printer->printModel(modelNonImportVersion);
    EXPECT_EQ(e, a);

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    auto generator = libcellml::Generator::create();

    generator->setModel(analyser->model());

    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.c"), generator->implementationCode());

    libcellml::GeneratorProfilePtr profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ("", generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.py"), generator->implementationCode());
}